

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::LookupBucketFor<unsigned_int>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,uint *Val,DenseSetPair<llvm::DWARFDebugNames::Abbrev> **FoundBucket)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar5;
  uint uVar6;
  ulong uVar7;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar8;
  int iVar9;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar5 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
LAB_00d4f660:
    bVar3 = false;
  }
  else {
    uVar1 = *Val;
    if (uVar1 + 1 < 2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, BucketT = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, LookupKeyT = unsigned int]"
                   );
    }
    lVar2 = *(long *)this;
    uVar4 = *(int *)(this + 0x10) - 1;
    uVar7 = (ulong)(uVar1 * 0x25 & uVar4);
    pDVar5 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)(lVar2 + uVar7 * 0x20);
    uVar6 = *(uint *)(lVar2 + uVar7 * 0x20);
    bVar3 = true;
    if (uVar6 != uVar1) {
      iVar9 = 1;
      pDVar8 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
      do {
        if (uVar6 == 0) {
          if (pDVar8 != (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0) {
            pDVar5 = pDVar8;
          }
          goto LAB_00d4f660;
        }
        if (pDVar8 != (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0) {
          pDVar5 = pDVar8;
        }
        if (uVar6 == 0xffffffff) {
          pDVar8 = pDVar5;
        }
        uVar6 = (int)uVar7 + iVar9;
        iVar9 = iVar9 + 1;
        uVar7 = (ulong)(uVar6 & uVar4);
        pDVar5 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)(lVar2 + uVar7 * 0x20);
        uVar6 = *(uint *)(lVar2 + uVar7 * 0x20);
      } while (uVar6 != uVar1);
    }
  }
  *FoundBucket = pDVar5;
  return bVar3;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }